

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x5134,"int ma_device__jack_buffer_size_callback(ma_jack_nframes_t, void *)");
  }
  uVar1 = *(uint *)((long)pUserData + 8);
  iVar3 = -4;
  if ((uVar1 & 0xfffffffe) == 2) {
    uVar4 = (ulong)(*(int *)((long)pUserData + 0x2bcc) * frameCount *
                   *(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x2bc8) * 4));
    pvVar2 = ma__malloc_from_callbacks(uVar4,(ma_allocation_callbacks *)(*pUserData + 0x20));
    if (pvVar2 == (void *)0x0) {
      return -4;
    }
    memset(pvVar2,0,uVar4);
    ma__free_from_callbacks
              (*(void **)((long)pUserData + 0x5580),(ma_allocation_callbacks *)(*pUserData + 0x20));
    *(void **)((long)pUserData + 0x5580) = pvVar2;
    *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
    uVar1 = *(uint *)((long)pUserData + 8);
  }
  if ((uVar1 | 2) == 3) {
    uVar4 = (ulong)(*(int *)((long)pUserData + 0x2f4) * frameCount *
                   *(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x2f0) * 4));
    pvVar2 = ma__malloc_from_callbacks(uVar4,(ma_allocation_callbacks *)(*pUserData + 0x20));
    if (pvVar2 != (void *)0x0) {
      iVar3 = 0;
      memset(pvVar2,0,uVar4);
      ma__free_from_callbacks
                (*(void **)((long)pUserData + 0x5578),(ma_allocation_callbacks *)(*pUserData + 0x20)
                );
      *(void **)((long)pUserData + 0x5578) = pvVar2;
      *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->capture.internalChannels * ma_get_bytes_per_sample(pDevice->capture.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferCapture, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferCapture = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->playback.internalChannels * ma_get_bytes_per_sample(pDevice->playback.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferPlayback, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferPlayback = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    return 0;
}